

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O3

void Gudhi::persistence_matrix::swap
               (Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                *col1,Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                      *col2)

{
  Index IVar1;
  Dimension DVar2;
  Row_container *pRVar3;
  pointer ppEVar4;
  Field_operators *pFVar5;
  Entry_constructor *pEVar6;
  pointer ppEVar7;
  pointer ppEVar8;
  pointer ppEVar9;
  
  pRVar3 = (col1->super_Row_access_option).rows_;
  (col1->super_Row_access_option).rows_ = (col2->super_Row_access_option).rows_;
  (col2->super_Row_access_option).rows_ = pRVar3;
  IVar1 = (col1->super_Row_access_option).columnIndex_;
  (col1->super_Row_access_option).columnIndex_ = (col2->super_Row_access_option).columnIndex_;
  (col2->super_Row_access_option).columnIndex_ = IVar1;
  DVar2 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar2;
  ppEVar4 = (col1->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppEVar7 = (col2->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar8 = (col1->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar9 = (col1->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (col1->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (col2->column_).
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (col1->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar7;
  (col1->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (col2->column_).
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (col2->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppEVar8;
  (col2->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar9;
  (col2->column_).
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar4;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::swap(&(col1->erasedValues_)._M_h,&(col2->erasedValues_)._M_h);
  pFVar5 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar5;
  pEVar6 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar6;
  return;
}

Assistant:

void swap(Vector_column& col1, Vector_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    col1.erasedValues_.swap(col2.erasedValues_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }